

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,DotOperator *d)

{
  pool_ref<soul::AST::Expression> *e;
  size_t *psVar1;
  UnqualifiedName *pUVar2;
  bool bVar3;
  int iVar4;
  ExpressionKind EVar5;
  ProcessorInstanceRef *pPVar6;
  ProcessorBase *pPVar7;
  Expression *pEVar8;
  Structure *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  string_view memberName;
  pool_ptr<soul::AST::ProcessorBase> processor;
  RefCountedPtr<soul::Structure> local_2d8;
  pool_ptr<soul::AST::ProcessorInstanceRef> processorInstance;
  pool_ptr<soul::AST::DotOperator> nestedDots;
  size_t local_2a8;
  DotOperator local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  size_t local_248;
  undefined1 local_240 [64];
  bool local_200;
  ulong local_1fc;
  undefined3 local_1f4;
  bool local_1f1;
  _Alloc_hider local_1f0 [2];
  pool_ref<soul::AST::Expression> local_1e0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1d8;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  e = &d->lhs;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
    local_1e0.object = e->object;
    unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&processorInstance;
    cast<soul::AST::ProcessorInstanceRef,soul::AST::Expression>
              ((soul *)unaff_R12->_M_local_buf,&local_1e0);
    if (processorInstance.object != (ProcessorInstanceRef *)0x0) {
      pPVar6 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator->(&processorInstance);
      (*(pPVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[6])
                (&processor,pPVar6);
      if (CONCAT44(processor.object._4_4_,processor.object._0_4_) != 0) {
        nestedDots.object = &local_298;
        local_2a8 = 0;
        local_258._M_allocated_capacity = (size_type)local_240;
        local_258._8_8_ = 0;
        local_248 = 8;
        local_200 = false;
        local_1fc = 0x1010101ffffffff;
        local_1f4._0_1_ = true;
        local_1f4._1_1_ = false;
        local_1f4._2_1_ = true;
        local_1f1 = false;
        AST::UnqualifiedName::getIdentifierPath((IdentifierPath *)&local_1d8,d->rhs);
        unaff_R12 = &local_258;
        ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
                  ((ArrayWithPreallocation<soul::Identifier,_8UL> *)unaff_R12,&local_1d8);
        ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_1d8);
        local_200 = true;
        local_1fc = local_1fc & 0xffffffff;
        local_1f4._0_1_ = false;
        local_1f4._1_1_ = false;
        local_1f4._2_1_ = true;
        pPVar7 = pool_ptr<soul::AST::ProcessorBase>::operator->(&processor);
        AST::Scope::performFullNameSearch
                  (&(pPVar7->super_ModuleBase).super_Scope,(NameSearch *)&nestedDots,
                   (Statement *)0x0);
        AST::Scope::NameSearch::~NameSearch((NameSearch *)&nestedDots);
      }
    }
    local_1f0[0]._M_p = (pointer)e->object;
    cast<soul::AST::DotOperator,soul::AST::Expression>
              ((soul *)&nestedDots,(pool_ref<soul::AST::Expression> *)local_1f0);
    if (nestedDots.object != (DotOperator *)0x0) {
      if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
          != true) {
        Errors::invalidEndpointSpecifier<>();
        AST::Context::throwError
                  (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_110,false);
      }
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
      ;
      *psVar1 = *psVar1 + 1;
    }
  }
  bVar3 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    ((ErrorIgnoringRewritingASTVisitor *)this,e->object);
  if (bVar3) {
    return &d->super_Expression;
  }
  pEVar8 = e->object;
  EVar5 = pEVar8->kind;
  if (EVar5 == type) {
    iVar4 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar8);
    pEVar8 = e->object;
    if ((char)iVar4 != '\0') {
      createTypeMetaFunction
                ((QualifiedIdentifierResolver *)&nestedDots,(UnqualifiedName *)this,
                 &d->rhs->super_Expression);
      if (nestedDots.object != (DotOperator *)0x0) {
        pEVar8 = pool_ptr<soul::AST::Expression>::operator*
                           ((pool_ptr<soul::AST::Expression> *)&nestedDots);
        return pEVar8;
      }
      goto LAB_00219387;
    }
    EVar5 = pEVar8->kind;
  }
  if (EVar5 == value) {
    iVar4 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar8);
    pEVar8 = e->object;
    if ((char)iVar4 != '\0') {
      (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[4])(&processor,pEVar8);
      if ((char)processor.object == '\x06') {
        this_00 = Type::getStructRef((Type *)&processor);
        AST::UnqualifiedName::toString_abi_cxx11_((string *)&nestedDots,d->rhs);
        memberName._M_str = (char *)nestedDots.object;
        memberName._M_len = local_2a8;
        bVar3 = Structure::hasMemberWithName(this_00,memberName);
        if (bVar3) {
          unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)PoolAllocator::
                         allocate<soul::AST::StructMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Structure&,std::__cxx11::string>
                                   (&((this->super_ModuleInstanceResolver).
                                      super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                    &(d->super_Expression).super_Statement.super_ASTObject.context,e
                                    ,this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&nestedDots);
        }
        else if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 ignoreErrors == false) {
          pUVar2 = d->rhs;
          AST::UnqualifiedName::toString_abi_cxx11_((string *)&local_1d8,pUVar2);
          Type::getDescription_abi_cxx11_((string *)&processorInstance,(Type *)&processor);
          Errors::unknownMemberInStruct<std::__cxx11::string,std::__cxx11::string>
                    (&local_148,(Errors *)&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &processorInstance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar8);
          AST::Context::throwError
                    (&(pUVar2->super_Expression).super_Statement.super_ASTObject.context,&local_148,
                     false);
        }
        std::__cxx11::string::~string((string *)&nestedDots);
        if (bVar3) goto LAB_00219346;
LAB_0021934a:
        createTypeMetaFunction
                  ((QualifiedIdentifierResolver *)&nestedDots,(UnqualifiedName *)this,
                   &d->rhs->super_Expression);
        bVar3 = nestedDots.object == (DotOperator *)0x0;
        if (!bVar3) {
          unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pool_ptr<soul::AST::Expression>::operator*
                                   ((pool_ptr<soul::AST::Expression> *)&nestedDots);
        }
      }
      else {
        if (1 < processor.object._4_4_ - 5U) goto LAB_0021934a;
        AST::UnqualifiedName::toString_abi_cxx11_((string *)&nestedDots,d->rhs);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&nestedDots,"real");
        if ((!bVar3) &&
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&nestedDots,"imag"), !bVar3)) {
          pUVar2 = d->rhs;
          AST::UnqualifiedName::toString_abi_cxx11_((string *)&local_1d8,pUVar2);
          Type::getDescription_abi_cxx11_((string *)&processorInstance,(Type *)&processor);
          Errors::unknownMemberInComplex<std::__cxx11::string,std::__cxx11::string>
                    (&local_180,(Errors *)&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &processorInstance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar8);
          AST::Context::throwError
                    (&(pUVar2->super_Expression).super_Statement.super_ASTObject.context,&local_180,
                     false);
        }
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)PoolAllocator::
                       allocate<soul::AST::ComplexMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Type&,std::__cxx11::string>
                                 (&((this->super_ModuleInstanceResolver).
                                    super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                  &(d->super_Expression).super_Statement.super_ASTObject.context,e,
                                  (Type *)&processor,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&nestedDots);
        std::__cxx11::string::~string((string *)&nestedDots);
LAB_00219346:
        bVar3 = false;
      }
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_2d8);
      if (!bVar3) {
        return (Expression *)unaff_R12;
      }
      goto LAB_00219387;
    }
  }
  iVar4 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[9])(pEVar8);
  if ((char)iVar4 != '\0') {
    if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
      return &d->super_Expression;
    }
    AST::UnqualifiedName::toString_abi_cxx11_((string *)&nestedDots,d->rhs);
    bVar3 = std::operator==((string *)&nestedDots,"type");
    std::__cxx11::string::~string((string *)&nestedDots);
    if (bVar3) {
      return &d->super_Expression;
    }
    Errors::noSuchOperationOnEndpoint<>();
    AST::Context::throwError
              (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
  }
  if ((e->object->kind == processor) &&
     (iVar4 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar4 != '\0')) {
    if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
      return &d->super_Expression;
    }
    Errors::noSuchOperationOnProcessor<>();
    AST::Context::throwError
              (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false);
  }
LAB_00219387:
  if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
      true) {
    psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
    *psVar1 = *psVar1 + 1;
    return &d->super_Expression;
  }
  Errors::invalidDotArguments<>();
  AST::Context::throwError
            (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false);
}

Assistant:

AST::Expression& visit (AST::DotOperator& d) override
        {
            auto& result = super::visit (d);

            if (std::addressof (result) != std::addressof (d))
                return result;

            if (currentConnectionEndpoint != nullptr)
            {
                if (auto processorInstance = cast<AST::ProcessorInstanceRef> (d.lhs))
                {
                    if (auto processor = processorInstance->getAsProcessor())
                    {
                        AST::Scope::NameSearch search;
                        search.partiallyQualifiedPath = d.rhs.getIdentifierPath();
                        search.stopAtFirstScopeWithResults = true;
                        search.findVariables = false;
                        search.findTypes = false;
                        search.findFunctions = false;
                        search.findNamespaces = false;
                        search.findProcessors = false;
                        search.findProcessorInstances = false;
                        search.findEndpoints = true;

                        processor->performFullNameSearch (search, nullptr);

                        if (search.itemsFound.size() == 1)
                            if (is_type<AST::EndpointDeclaration> (search.itemsFound.front()))
                                return allocator.allocate<AST::ConnectionEndpointRef> (d.context,
                                                                                       processorInstance,
                                                                                       allocator.allocate<AST::UnqualifiedName> (d.context, d.rhs.identifier));
                    }
                }

                if (auto nestedDots = cast<AST::DotOperator> (d.lhs))
                {
                    if (ignoreErrors)
                        ++numFails;
                    else
                        d.context.throwError (Errors::invalidEndpointSpecifier());
                }
            }

            if (failIfNotResolved (d.lhs))
                return result;

            if (AST::isResolvedAsType (d.lhs.get()))
            {
                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (AST::isResolvedAsValue (d.lhs.get()))
            {
                auto lhsType = d.lhs->getResultType();

                if (lhsType.isStruct())
                {
                    auto& s = lhsType.getStructRef();
                    auto name = d.rhs.toString();

                    if (s.hasMemberWithName (name))
                        return allocator.allocate<AST::StructMemberRef> (d.context, d.lhs, s, std::move (name));

                    if (! ignoreErrors)
                        d.rhs.context.throwError (Errors::unknownMemberInStruct (d.rhs.toString(), lhsType.getDescription()));
                }
                else if (lhsType.isComplex())
                {
                    auto name = d.rhs.toString();

                    if (name == "real" || name == "imag")
                        return allocator.allocate<AST::ComplexMemberRef> (d.context, d.lhs, lhsType, std::move (name));

                    d.rhs.context.throwError (Errors::unknownMemberInComplex (d.rhs.toString(), lhsType.getDescription()));
                }

                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (d.lhs->isOutputEndpoint())
            {
                if (currentConnectionEndpoint != nullptr || d.rhs.toString() == "type")
                    return d;

                d.context.throwError (Errors::noSuchOperationOnEndpoint());
            }
            else if (AST::isResolvedAsProcessor (d.lhs.get()))
            {
                if (currentConnectionEndpoint != nullptr)
                    return d;

                d.context.throwError (Errors::noSuchOperationOnProcessor());
            }

            if (ignoreErrors)
                ++numFails;
            else
                d.context.throwError (Errors::invalidDotArguments());

            return d;
        }